

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsCore helicsCoreClone(HelicsCore core,HelicsError *err)

{
  undefined8 *puVar1;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var2;
  bool bVar3;
  __single_object coreClone;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_30;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_28;
  MasterObjectHolder *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (core == (HelicsCore)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019885c;
    }
    else {
      bVar3 = *(int *)((long)core + 0x44) == 0x378424ec;
      puVar1 = (undefined8 *)0x0;
      if (bVar3) {
        puVar1 = (undefined8 *)core;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019885f;
    }
    err->error_code = -3;
    err->message = "core object is not valid";
  }
LAB_0019885c:
  puVar1 = (undefined8 *)0x0;
LAB_0019885f:
  if (puVar1 == (undefined8 *)0x0) {
    _Var2._M_head_impl = (CoreObject *)0x0;
  }
  else {
    local_30._M_head_impl = (CoreObject *)operator_new(0x48);
    ((local_30._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_30._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_30._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_30._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_30._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_30._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_30._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    ((local_30._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_30._M_head_impl)->index = 0;
    (local_30._M_head_impl)->valid = 0;
    (local_30._M_head_impl)->valid = -2;
    (local_30._M_head_impl)->valid = 0x378424ec;
    ((local_30._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)*puVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_30._M_head_impl)->coreptr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
    _Var2._M_head_impl = local_30._M_head_impl;
    getMasterHolder();
    local_28._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         local_30._M_head_impl;
    local_30._M_head_impl = (CoreObject *)0x0;
    MasterObjectHolder::addCore
              (local_20,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_28);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_28
              );
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_30
              );
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsCore helicsCoreClone(HelicsCore core, HelicsError* err)
{
    auto* coreObj = helics::getCoreObject(core, err);
    if (coreObj == nullptr) {
        return nullptr;
    }
    try {
        auto coreClone = std::make_unique<helics::CoreObject>();
        coreClone->valid = gCoreValidationIdentifier;
        coreClone->coreptr = coreObj->coreptr;
        auto* retcore = reinterpret_cast<HelicsCore>(coreClone.get());
        getMasterHolder()->addCore(std::move(coreClone));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}